

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O2

void oki_adpcm_init(oki_adpcm_state *adpcm,INT8 *custom_index_shift,INT16 *custom_diff_lookup)

{
  INT8 *pIVar1;
  int iVar2;
  long lVar3;
  INT16 *pIVar4;
  long lVar5;
  double dVar6;
  
  pIVar1 = s_index_shift;
  if (custom_index_shift != (INT8 *)0x0) {
    pIVar1 = custom_index_shift;
  }
  adpcm->index_shift = pIVar1;
  if (custom_diff_lookup == (INT16 *)0x0) {
    if (s_tables_computed == '\0') {
      s_tables_computed = '\x01';
      pIVar4 = s_diff_lookup;
      for (lVar5 = 0; lVar5 != 0x31; lVar5 = lVar5 + 1) {
        dVar6 = pow(1.1,(double)(int)lVar5);
        dVar6 = floor(dVar6 * 16.0);
        iVar2 = (int)dVar6;
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          pIVar4[lVar3] =
               ((short)(char)(&DAT_0016dc81)[lVar3 * 4] * (short)iVar2 + (short)(iVar2 / 8) +
               (short)(char)(&DAT_0016dc83)[lVar3 * 4] * (short)(iVar2 / 4) +
               (short)(char)(&DAT_0016dc82)[lVar3 * 4] * (short)(iVar2 / 2)) *
               (short)(char)(&compute_tables_nbl2bit)[lVar3 * 4];
        }
        pIVar4 = pIVar4 + 0x10;
      }
    }
    custom_diff_lookup = s_diff_lookup;
  }
  adpcm->diff_lookup = custom_diff_lookup;
  adpcm->signal = -2;
  adpcm->step = 0;
  return;
}

Assistant:

void oki_adpcm_init(oki_adpcm_state* adpcm, const INT8* custom_index_shift, const INT16* custom_diff_lookup)
{
	adpcm->index_shift =  (custom_index_shift != NULL) ? custom_index_shift : s_index_shift;
	if (custom_diff_lookup != NULL)
	{
		adpcm->diff_lookup = custom_diff_lookup;
	}
	else
	{
		compute_tables();
		adpcm->diff_lookup = s_diff_lookup;
	}
	oki_adpcm_reset(adpcm);
	
	return;
}